

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_utils.hpp
# Opt level: O0

string * uuid::generate_uuid_v4_abi_cxx11_(void)

{
  result_type_conflict1 rVar1;
  string *in_RDI;
  int local_19c;
  stringstream local_198 [4];
  int i;
  stringstream ss;
  ostream local_188 [384];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,std::hex);
  for (local_19c = 0; local_19c < 8; local_19c = local_19c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<(local_188,rVar1);
  }
  std::operator<<(local_188,"-");
  for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<(local_188,rVar1);
  }
  std::operator<<(local_188,"-4");
  for (local_19c = 0; local_19c < 3; local_19c = local_19c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<(local_188,rVar1);
  }
  std::operator<<(local_188,"-");
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&dis2,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)gen);
  std::ostream::operator<<(local_188,rVar1);
  for (local_19c = 0; local_19c < 3; local_19c = local_19c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<(local_188,rVar1);
  }
  std::operator<<(local_188,"-");
  for (local_19c = 0; local_19c < 0xc; local_19c = local_19c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<(local_188,rVar1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string generate_uuid_v4() {
  std::stringstream ss;
  int i;
  ss << std::hex;
  for (i = 0; i < 8; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 4; i++) {
    ss << dis(gen);
  }
  ss << "-4";
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  ss << dis2(gen);
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 12; i++) {
    ss << dis(gen);
  };
  return ss.str();
}